

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O1

UnicodeString * __thiscall
icu_63::Normalizer2WithImpl::normalizeSecondAndAppend
          (Normalizer2WithImpl *this,UnicodeString *first,UnicodeString *second,UBool doNormalize,
          UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  char16_t *pcVar4;
  int32_t iVar5;
  int32_t iVar6;
  ReorderingBuffer buffer;
  UnicodeString safeMiddle;
  ReorderingBuffer local_b0;
  UnicodeString local_70;
  
  if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((undefined1  [56])((undefined1  [56])first->fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (second->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar4 = (second->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&second->fUnion + 2);
      }
    }
    else {
      pcVar4 = (char16_t *)0x0;
    }
    if (first == second || pcVar4 == (char16_t *)0x0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      sVar2 = (first->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar6 = (first->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar2 >> 5;
      }
      local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258
      ;
      local_70.fUnion.fStackFields.fLengthAndFlags = 2;
      local_b0.impl = this->impl;
      local_b0.start = (UChar *)0x0;
      local_b0.reorderStart._0_5_ = 0;
      local_b0.reorderStart._5_3_ = 0;
      local_b0.limit._0_5_ = 0;
      local_b0._37_8_ = 0;
      if ((short)uVar1 < 0) {
        iVar5 = (second->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)(short)uVar1 >> 5;
      }
      local_b0.str = first;
      iVar3 = ReorderingBuffer::init(&local_b0,(EVP_PKEY_CTX *)(ulong)(uint)(iVar5 + iVar6));
      if ((char)iVar3 != '\0') {
        sVar2 = (second->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar3 = (second->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar2 >> 5;
        }
        (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x13])
                  (this,pcVar4,pcVar4 + iVar3,(ulong)(uint)(int)doNormalize,&local_70,&local_b0,
                   errorCode);
      }
      ReorderingBuffer::~ReorderingBuffer(&local_b0);
      if (U_ZERO_ERROR < *errorCode) {
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace
                  (first,iVar6 - local_70.fUnion.fFields.fLength,0x7fffffff,&local_70,0,
                   local_70.fUnion.fFields.fLength);
      }
      UnicodeString::~UnicodeString(&local_70);
    }
  }
  return first;
}

Assistant:

UnicodeString &
    normalizeSecondAndAppend(UnicodeString &first,
                             const UnicodeString &second,
                             UBool doNormalize,
                             UErrorCode &errorCode) const {
        uprv_checkCanGetBuffer(first, errorCode);
        if(U_FAILURE(errorCode)) {
            return first;
        }
        const UChar *secondArray=second.getBuffer();
        if(&first==&second || secondArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return first;
        }
        int32_t firstLength=first.length();
        UnicodeString safeMiddle;
        {
            ReorderingBuffer buffer(impl, first);
            if(buffer.init(firstLength+second.length(), errorCode)) {
                normalizeAndAppend(secondArray, secondArray+second.length(), doNormalize,
                                   safeMiddle, buffer, errorCode);
            }
        }  // The ReorderingBuffer destructor finalizes the first string.
        if(U_FAILURE(errorCode)) {
            // Restore the modified suffix of the first string.
            first.replace(firstLength-safeMiddle.length(), 0x7fffffff, safeMiddle);
        }
        return first;
    }